

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

bool __thiscall Parser::IsSpecialName(Parser *this,IdentPtr pid)

{
  bool bVar1;
  
  bVar1 = true;
  if (((((this->wellKnownPropertyPids)._this != pid) &&
       ((this->wellKnownPropertyPids)._super != pid)) &&
      ((this->wellKnownPropertyPids)._superConstructor != pid)) &&
     ((this->wellKnownPropertyPids)._newTarget != pid)) {
    bVar1 = (this->wellKnownPropertyPids)._importMeta == pid;
  }
  return bVar1;
}

Assistant:

bool Parser::IsSpecialName(IdentPtr pid)
{
    return pid == wellKnownPropertyPids._this ||
        pid == wellKnownPropertyPids._super ||
        pid == wellKnownPropertyPids._superConstructor ||
        pid == wellKnownPropertyPids._newTarget ||
        pid == wellKnownPropertyPids._importMeta;
}